

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O1

yajl_status yajl_do_finish(yajl_handle hand)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  yajl_status yVar4;
  
  yVar4 = yajl_do_parse(hand," ",1);
  if (yVar4 == yajl_status_ok) {
    puVar2 = (hand->stateStack).stack;
    sVar3 = (hand->stateStack).used;
    bVar1 = puVar2[sVar3 - 1];
    yVar4 = yajl_status_error;
    if (1 < bVar1 - 2) {
      if ((bVar1 == 0xc) || (bVar1 == 1)) {
        yVar4 = yajl_status_ok;
      }
      else {
        yVar4 = yajl_status_ok;
        if ((hand->flags & 0x10) == 0) {
          puVar2[sVar3 - 1] = '\x02';
          hand->parseError = "premature EOF";
          yVar4 = yajl_status_error;
        }
      }
    }
  }
  return yVar4;
}

Assistant:

yajl_status
yajl_do_finish(yajl_handle hand)
{
    yajl_status stat;
    stat = yajl_do_parse(hand,(const unsigned char *) " ",1);

    if (stat != yajl_status_ok) return stat;

    switch(yajl_bs_current(hand->stateStack))
    {
        case yajl_state_parse_error:
        case yajl_state_lexical_error:
            return yajl_status_error;
        case yajl_state_got_value:
        case yajl_state_parse_complete:
            return yajl_status_ok;
        default:
            if (!(hand->flags & yajl_allow_partial_values))
            {
                yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                hand->parseError = "premature EOF";
                return yajl_status_error;
            }
            return yajl_status_ok;
    }
}